

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

size_t quicly_decode_packet
                 (quicly_context_t *ctx,quicly_decoded_packet_t *packet,uint8_t *datagram,
                 size_t datagram_size,size_t *off)

{
  uint8_t *puVar1;
  undefined1 *puVar2;
  uint8_t *end;
  byte bVar3;
  uint uVar4;
  st_quicly_cid_encryptor_t *psVar5;
  bool bVar6;
  bool bVar7;
  size_t sVar8;
  uint64_t uVar9;
  ulong uVar10;
  byte *pbVar11;
  ulong uVar12;
  long lVar13;
  byte *local_28;
  
  uVar10 = *off;
  if (datagram_size < uVar10) {
    local_28 = datagram;
    __assert_fail("*off <= datagram_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0x261,
                  "size_t quicly_decode_packet(quicly_context_t *, quicly_decoded_packet_t *, const uint8_t *, size_t, size_t *)"
                 );
  }
  pbVar11 = datagram + uVar10;
  (packet->octets).base = pbVar11;
  (packet->octets).len = datagram_size - uVar10;
  if (datagram_size - uVar10 < 2) {
    return 0xffffffffffffffff;
  }
  end = datagram + datagram_size;
  sVar8 = 0;
  if (*off == 0) {
    sVar8 = datagram_size;
  }
  packet->datagram_size = sVar8;
  (packet->token).base = (uint8_t *)0x0;
  (packet->token).len = 0;
  (packet->decrypted).pn = 0xffffffffffffffff;
  sVar8 = *off;
  local_28 = datagram + sVar8 + 1;
  if (-1 < (char)*pbVar11) {
    psVar5 = ctx->cid_encryptor;
    if (psVar5 == (st_quicly_cid_encryptor_t *)0x0) {
      (packet->cid).dest.encrypted.base = (uint8_t *)0x0;
      (packet->cid).dest.encrypted.len = 0;
      (packet->cid).dest.plaintext = quicly_cid_plaintext_invalid;
    }
    else {
      if ((long)end - (long)local_28 < 0x14) {
        return 0xffffffffffffffff;
      }
      sVar8 = (*psVar5->decrypt_cid)(psVar5,&(packet->cid).dest.plaintext,local_28,0);
      if (sVar8 == 0xffffffffffffffff) {
        return 0xffffffffffffffff;
      }
      (packet->cid).dest.encrypted.base = local_28;
      (packet->cid).dest.encrypted.len = sVar8;
      local_28 = local_28 + sVar8;
    }
    puVar2 = &(packet->cid).dest.field_0x20;
    *puVar2 = *puVar2 & 0xfe;
    (packet->cid).src.base = (uint8_t *)0x0;
    (packet->cid).src.len = 0;
    packet->version = 0;
    packet->encrypted_off = (long)local_28 - (long)(packet->octets).base;
    packet->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_MAYBE_STATELESS_RESET;
    goto LAB_0011b0b8;
  }
  if ((long)end - (long)local_28 < 5) {
LAB_0011b077:
    bVar6 = true;
  }
  else {
    uVar4 = *(uint *)(datagram + sVar8 + 1);
    packet->version =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    puVar1 = datagram + sVar8 + 6;
    uVar10 = (ulong)datagram[sVar8 + 5];
    (packet->cid).dest.encrypted.len = uVar10;
    if ((ulong)((long)end - (long)puVar1) <= uVar10) goto LAB_0011b077;
    (packet->cid).dest.encrypted.base = puVar1;
    local_28 = puVar1 + uVar10 + 1;
    uVar12 = (ulong)puVar1[uVar10];
    (packet->cid).src.len = uVar12;
    if ((ulong)((long)end - (long)local_28) < uVar12) goto LAB_0011b077;
    (packet->cid).src.base = local_28;
    local_28 = local_28 + uVar12;
    if ((*pbVar11 & 0xf0 | 0x10) == 0xd0) {
      psVar5 = ctx->cid_encryptor;
      if ((uVar10 == 0 || psVar5 == (st_quicly_cid_encryptor_t *)0x0) ||
         (sVar8 = (*psVar5->decrypt_cid)(psVar5,&(packet->cid).dest.plaintext,puVar1,uVar10),
         sVar8 == 0xffffffffffffffff)) {
        (packet->cid).dest.plaintext = quicly_cid_plaintext_invalid;
      }
      puVar2 = &(packet->cid).dest.field_0x20;
      *puVar2 = *puVar2 | 1;
    }
    else {
      psVar5 = ctx->cid_encryptor;
      if (psVar5 == (st_quicly_cid_encryptor_t *)0x0) {
        (packet->cid).dest.plaintext = quicly_cid_plaintext_invalid;
      }
      else if ((uVar10 == 0) ||
              (sVar8 = (*psVar5->decrypt_cid)(psVar5,&(packet->cid).dest.plaintext,puVar1,uVar10),
              sVar8 == 0xffffffffffffffff)) goto LAB_0011b077;
      puVar2 = &(packet->cid).dest.field_0x20;
      *puVar2 = *puVar2 & 0xfe;
    }
    if ((packet->version == 0xff00001d) || (packet->version == 0xff00001b)) {
      pbVar11 = (packet->octets).base;
      bVar3 = *pbVar11;
      if (bVar3 < 0xf0) {
        if ((bVar3 & 0xf0) == 0xc0) {
          uVar9 = ptls_decode_quicint(&local_28,end);
          bVar6 = true;
          if (uVar9 == 0xffffffffffffffff) {
            bVar7 = false;
          }
          else {
            bVar7 = false;
            if (uVar9 <= (ulong)((long)end - (long)local_28)) {
              (packet->token).base = local_28;
              (packet->token).len = uVar9;
              local_28 = local_28 + uVar9;
              bVar7 = true;
              bVar6 = false;
            }
          }
          if (!bVar7) goto LAB_0011b07c;
        }
        uVar9 = ptls_decode_quicint(&local_28,end);
        if (uVar9 + 1 < 2) goto LAB_0011b077;
        bVar6 = true;
        if (uVar9 <= (ulong)((long)end - (long)local_28)) {
          sVar8 = (long)local_28 - (long)(packet->octets).base;
          packet->encrypted_off = sVar8;
          (packet->octets).len = sVar8 + uVar9;
          goto LAB_0011b207;
        }
      }
      else {
        lVar13 = (long)end - (long)local_28;
        bVar6 = true;
        if (0x10 < lVar13) {
          (packet->token).base = local_28;
          (packet->token).len = lVar13 - 0x10;
          packet->encrypted_off = (size_t)(local_28 + ((lVar13 + -0x10) - (long)pbVar11));
          goto LAB_0011b207;
        }
      }
    }
    else {
      packet->encrypted_off = (long)local_28 - (long)(packet->octets).base;
LAB_0011b207:
      packet->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET;
      bVar6 = false;
    }
  }
LAB_0011b07c:
  if (bVar6) {
    return 0xffffffffffffffff;
  }
LAB_0011b0b8:
  *off = *off + (packet->octets).len;
  return (packet->octets).len;
}

Assistant:

size_t quicly_decode_packet(quicly_context_t *ctx, quicly_decoded_packet_t *packet, const uint8_t *datagram, size_t datagram_size,
                            size_t *off)
{
    const uint8_t *src = datagram, *src_end = datagram + datagram_size;

    assert(*off <= datagram_size);

    packet->octets = ptls_iovec_init(src + *off, datagram_size - *off);
    if (packet->octets.len < 2)
        goto Error;
    packet->datagram_size = *off == 0 ? datagram_size : 0;
    packet->token = ptls_iovec_init(NULL, 0);
    packet->decrypted.pn = UINT64_MAX;

    /* move the cursor to the second byte */
    src += *off + 1;

    if (QUICLY_PACKET_IS_LONG_HEADER(packet->octets.base[0])) {
        /* long header */
        uint64_t rest_length;
        if (src_end - src < 5)
            goto Error;
        packet->version = quicly_decode32(&src);
        packet->cid.dest.encrypted.len = *src++;
        if (src_end - src < packet->cid.dest.encrypted.len + 1)
            goto Error;
        packet->cid.dest.encrypted.base = (uint8_t *)src;
        src += packet->cid.dest.encrypted.len;
        packet->cid.src.len = *src++;
        if (src_end - src < packet->cid.src.len)
            goto Error;
        packet->cid.src.base = (uint8_t *)src;
        src += packet->cid.src.len;
        switch (packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) {
        case QUICLY_PACKET_TYPE_INITIAL:
        case QUICLY_PACKET_TYPE_0RTT:
            if (ctx->cid_encryptor == NULL || packet->cid.dest.encrypted.len == 0 ||
                ctx->cid_encryptor->decrypt_cid(ctx->cid_encryptor, &packet->cid.dest.plaintext, packet->cid.dest.encrypted.base,
                                                packet->cid.dest.encrypted.len) == SIZE_MAX)
                packet->cid.dest.plaintext = quicly_cid_plaintext_invalid;
            packet->cid.dest.might_be_client_generated = 1;
            break;
        default:
            if (ctx->cid_encryptor != NULL) {
                if (packet->cid.dest.encrypted.len == 0)
                    goto Error;
                if (ctx->cid_encryptor->decrypt_cid(ctx->cid_encryptor, &packet->cid.dest.plaintext,
                                                    packet->cid.dest.encrypted.base, packet->cid.dest.encrypted.len) == SIZE_MAX)
                    goto Error;
            } else {
                packet->cid.dest.plaintext = quicly_cid_plaintext_invalid;
            }
            packet->cid.dest.might_be_client_generated = 0;
            break;
        }
        switch (packet->version) {
        case QUICLY_PROTOCOL_VERSION_CURRENT:
        case QUICLY_PROTOCOL_VERSION_DRAFT27:
            /* these are the recognized versions, and they share the same packet header format */
            if ((packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) == QUICLY_PACKET_TYPE_RETRY) {
                /* retry */
                if (src_end - src <= PTLS_AESGCM_TAG_SIZE)
                    goto Error;
                packet->token = ptls_iovec_init(src, src_end - src - PTLS_AESGCM_TAG_SIZE);
                src += packet->token.len;
                packet->encrypted_off = src - packet->octets.base;
            } else {
                /* coalescible long header packet */
                if ((packet->octets.base[0] & QUICLY_PACKET_TYPE_BITMASK) == QUICLY_PACKET_TYPE_INITIAL) {
                    /* initial has a token */
                    uint64_t token_len;
                    if ((token_len = quicly_decodev(&src, src_end)) == UINT64_MAX)
                        goto Error;
                    if (src_end - src < token_len)
                        goto Error;
                    packet->token = ptls_iovec_init(src, token_len);
                    src += token_len;
                }
                if ((rest_length = quicly_decodev(&src, src_end)) == UINT64_MAX)
                    goto Error;
                if (rest_length < 1)
                    goto Error;
                if (src_end - src < rest_length)
                    goto Error;
                packet->encrypted_off = src - packet->octets.base;
                packet->octets.len = packet->encrypted_off + rest_length;
            }
            break;
        default:
            /* VN packet or packets of unknown version cannot be parsed. `encrypted_off` is set to the first byte after SCID. */
            packet->encrypted_off = src - packet->octets.base;
        }
        packet->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_NOT_STATELESS_RESET;
    } else {
        /* short header */
        if (ctx->cid_encryptor != NULL) {
            if (src_end - src < QUICLY_MAX_CID_LEN_V1)
                goto Error;
            size_t local_cidl = ctx->cid_encryptor->decrypt_cid(ctx->cid_encryptor, &packet->cid.dest.plaintext, src, 0);
            if (local_cidl == SIZE_MAX)
                goto Error;
            packet->cid.dest.encrypted = ptls_iovec_init(src, local_cidl);
            src += local_cidl;
        } else {
            packet->cid.dest.encrypted = ptls_iovec_init(NULL, 0);
            packet->cid.dest.plaintext = quicly_cid_plaintext_invalid;
        }
        packet->cid.dest.might_be_client_generated = 0;
        packet->cid.src = ptls_iovec_init(NULL, 0);
        packet->version = 0;
        packet->encrypted_off = src - packet->octets.base;
        packet->_is_stateless_reset_cached = QUICLY__DECODED_PACKET_CACHED_MAYBE_STATELESS_RESET;
    }

    *off += packet->octets.len;
    return packet->octets.len;

Error:
    return SIZE_MAX;
}